

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units-test.c++
# Opt level: O1

void __thiscall kj::anon_unknown_0::TestCase266::run(TestCase266 *this)

{
  uint uVar1;
  Iterator __begin2;
  uint uVar2;
  bool bVar3;
  uint expected;
  DebugComparison<kj::SafeUnwrapper<10UL,_unsigned_char>,_unsigned_int> _kjCondition;
  uint local_5c;
  undefined1 local_58 [16];
  char *local_48;
  size_t local_40;
  bool local_38;
  
  local_5c = 0;
  uVar2 = 0;
  do {
    uVar1 = local_5c + 1;
    local_58[0] = (uchar)uVar2;
    local_58._4_4_ = local_5c;
    local_58._8_8_ = " == ";
    local_48 = &DAT_00000005;
    bVar3 = uVar2 == local_5c;
    local_40 = CONCAT71(local_40._1_7_,bVar3);
    local_5c = uVar1;
    if ((!bVar3) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::
      log<char_const(&)[46],kj::_::DebugComparison<kj::SafeUnwrapper<10ul,unsigned_char>,unsigned_int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/units-test.c++"
                 ,0x10e,ERROR,"\"failed: expected \" \"unbound(value) == expected++\", _kjCondition"
                 ,(char (*) [46])"failed: expected unbound(value) == expected++",
                 (DebugComparison<kj::SafeUnwrapper<10UL,_unsigned_char>,_unsigned_int> *)local_58);
    }
    uVar2 = uVar2 + 1;
  } while (uVar2 != 10);
  local_58._0_8_ = &local_5c;
  local_38 = local_5c == 10;
  local_58._8_4_ = 10;
  local_48 = " == ";
  local_40 = 5;
  if ((!local_38) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[32],kj::_::DebugComparison<unsigned_int&,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/units-test.c++"
               ,0x110,ERROR,"\"failed: expected \" \"expected == 10\", _kjCondition",
               (char (*) [32])"failed: expected expected == 10",
               (DebugComparison<unsigned_int_&,_int> *)local_58);
  }
  local_5c = 0;
  uVar2 = 0;
  do {
    uVar1 = local_5c + 1;
    local_58[0] = (uchar)uVar2;
    local_58._4_4_ = local_5c;
    local_58._8_8_ = " == ";
    local_48 = &DAT_00000005;
    bVar3 = uVar2 == local_5c;
    local_40 = CONCAT71(local_40._1_7_,bVar3);
    local_5c = uVar1;
    if ((!bVar3) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::
      log<char_const(&)[46],kj::_::DebugComparison<kj::SafeUnwrapper<255ul,unsigned_char>,unsigned_int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/units-test.c++"
                 ,0x115,ERROR,"\"failed: expected \" \"unbound(value) == expected++\", _kjCondition"
                 ,(char (*) [46])"failed: expected unbound(value) == expected++",
                 (DebugComparison<kj::SafeUnwrapper<255UL,_unsigned_char>,_unsigned_int> *)local_58)
      ;
    }
    uVar2 = uVar2 + 1;
  } while (uVar2 != 10);
  local_38 = local_5c == 10;
  local_58._0_8_ = &local_5c;
  local_58._8_4_ = 10;
  local_48 = " == ";
  local_40 = 5;
  if ((!local_38) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[32],kj::_::DebugComparison<unsigned_int&,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/units-test.c++"
               ,0x117,ERROR,"\"failed: expected \" \"expected == 10\", _kjCondition",
               (char (*) [32])"failed: expected expected == 10",
               (DebugComparison<unsigned_int_&,_int> *)local_58);
  }
  local_5c = 3;
  uVar2 = 3;
  do {
    uVar1 = local_5c + 1;
    local_58[0] = (uchar)uVar2;
    local_58._4_4_ = local_5c;
    local_58._8_8_ = " == ";
    local_48 = &DAT_00000005;
    bVar3 = uVar2 == local_5c;
    local_40 = CONCAT71(local_40._1_7_,bVar3);
    local_5c = uVar1;
    if ((!bVar3) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::
      log<char_const(&)[46],kj::_::DebugComparison<kj::SafeUnwrapper<255ul,unsigned_char>,unsigned_int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/units-test.c++"
                 ,0x11c,ERROR,"\"failed: expected \" \"unbound(value) == expected++\", _kjCondition"
                 ,(char (*) [46])"failed: expected unbound(value) == expected++",
                 (DebugComparison<kj::SafeUnwrapper<255UL,_unsigned_char>,_unsigned_int> *)local_58)
      ;
    }
    uVar2 = uVar2 + 1;
  } while (uVar2 != 10);
  local_38 = local_5c == 10;
  local_58._0_8_ = &local_5c;
  local_58._8_4_ = 10;
  local_48 = " == ";
  local_40 = 5;
  if ((!local_38) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[32],kj::_::DebugComparison<unsigned_int&,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/units-test.c++"
               ,0x11e,ERROR,"\"failed: expected \" \"expected == 10\", _kjCondition",
               (char (*) [32])"failed: expected expected == 10",
               (DebugComparison<unsigned_int_&,_int> *)local_58);
  }
  return;
}

Assistant:

TEST(UnitMeasure, BoundedRange) {
  uint expected = 0;
  for (auto i: zeroTo(bounded<10>())) {
    Bounded<10, uint8_t> value = i;
    KJ_EXPECT(unbound(value) == expected++);
  }
  KJ_EXPECT(expected == 10);

  expected = 0;
  for (auto i: zeroTo(bounded((uint8_t)10))) {
    Bounded<255, uint8_t> value = i;
    KJ_EXPECT(unbound(value) == expected++);
  }
  KJ_EXPECT(expected == 10);

  expected = 3;
  for (auto i: range(bounded((uint8_t)3), bounded((uint8_t)10))) {
    Bounded<255, uint8_t> value = i;
    KJ_EXPECT(unbound(value) == expected++);
  }
  KJ_EXPECT(expected == 10);
}